

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O2

Abc_Cex_t * Llb_ManReachDeriveCex(Llb_Man_t *p)

{
  char *pcVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  int iVar4;
  char *string;
  Abc_Cex_t *p_00;
  DdNode *pDVar5;
  DdNode *n;
  DdNode *n_00;
  Aig_Man_t *pAVar6;
  int iVar7;
  long lVar8;
  int i;
  int iVar9;
  bool bVar10;
  DdNode *local_48;
  
  iVar3 = Cudd_ReadSize(p->ddR);
  string = (char *)malloc((long)iVar3);
  iVar3 = p->vRings->nSize;
  if (iVar3 < 1) {
    __assert_fail("Vec_PtrSize(p->vRings) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Reach.c"
                  ,0x1dc,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
  }
  p->dd->TimeStop = 0;
  p->ddR->TimeStop = 0;
  p_00 = Abc_CexAlloc(p->pAig->nRegs,p->pAig->nTruePis,iVar3);
  pVVar2 = p->vRings;
  iVar3 = pVVar2->nSize;
  p_00->iPo = -1;
  p_00->iFrame = iVar3 + -1;
  if ((long)iVar3 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  pDVar5 = Cudd_bddIntersect(p->ddR,(DdNode *)pVVar2->pArray[(long)iVar3 + -1],p->ddR->bFunc);
  Cudd_Ref(pDVar5);
  iVar3 = Cudd_bddPickOneCube(p->ddR,pDVar5,string);
  Cudd_RecursiveDeref(p->ddR,pDVar5);
  if (iVar3 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Reach.c"
                  ,0x1f2,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
  }
  pAVar6 = p->pAig;
  iVar3 = pAVar6->nTruePis;
  iVar9 = (p->vRings->nSize + -1) * iVar3 + pAVar6->nRegs;
  for (lVar8 = 0; iVar7 = (int)lVar8, iVar7 < iVar3; lVar8 = lVar8 + 1) {
    Vec_PtrEntry(pAVar6->vCis,iVar7);
    pAVar6 = p->pAig;
    if (string[lVar8 + pAVar6->nRegs] == '\x01') {
      (&p_00[1].iPo)[iVar9 + iVar7 >> 5] =
           (&p_00[1].iPo)[iVar9 + iVar7 >> 5] | 1 << ((byte)(iVar9 + iVar7) & 0x1f);
    }
    iVar3 = pAVar6->nTruePis;
  }
  iVar3 = p->vRings->nSize;
  if (iVar3 < 2) {
    local_48 = (DdNode *)0x0;
  }
  else {
    local_48 = Llb_CoreComputeCube(p->dd,p->vGlo2Ns,1,string);
    Cudd_Ref(local_48);
    iVar3 = p->vRings->nSize;
  }
  do {
    do {
      if (iVar3 < 1) {
        iVar3 = p->pAig->nRegs;
LAB_00660365:
        if (iVar9 != iVar3) {
          __assert_fail("nPiOffset == Saig_ManRegNum(p->pAig)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Reach.c"
                        ,0x230,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
        }
        iVar3 = Saig_ManFindFailedPoCex(p->pAigGlo,p_00);
        if ((-1 < iVar3) && (iVar3 < p->pAigGlo->nTruePos)) {
          p_00->iPo = iVar3;
          free(string);
          return p_00;
        }
        __assert_fail("RetValue >= 0 && RetValue < Saig_ManPoNum(p->pAigGlo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Reach.c"
                      ,0x234,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
      }
      iVar7 = iVar3 + -1;
      pDVar5 = (DdNode *)Vec_PtrEntry(p->vRings,iVar7);
      bVar10 = iVar3 == p->vRings->nSize;
      iVar3 = iVar7;
    } while (bVar10);
    n = Llb_ManComputeImage(p,local_48,1);
    if (n == (DdNode *)0x0) {
      __assert_fail("bImage != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Reach.c"
                    ,0x208,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
    }
    Cudd_Ref(n);
    Cudd_RecursiveDeref(p->dd,local_48);
    n_00 = Extra_TransferPermute(p->dd,p->ddR,n,p->vCs2Glo->pArray);
    Cudd_Ref(n_00);
    Cudd_RecursiveDeref(p->dd,n);
    pDVar5 = Cudd_bddIntersect(p->ddR,n_00,pDVar5);
    Cudd_Ref(pDVar5);
    Cudd_RecursiveDeref(p->ddR,n_00);
    iVar4 = Cudd_bddPickOneCube(p->ddR,pDVar5,string);
    Cudd_RecursiveDeref(p->ddR,pDVar5);
    if (iVar4 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Reach.c"
                    ,0x219,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
    }
    pAVar6 = p->pAig;
    iVar4 = pAVar6->nTruePis;
    iVar9 = iVar9 - iVar4;
    for (lVar8 = 0; i = (int)lVar8, i < iVar4; lVar8 = lVar8 + 1) {
      Vec_PtrEntry(pAVar6->vCis,i);
      pAVar6 = p->pAig;
      if (string[lVar8 + pAVar6->nRegs] == '\x01') {
        (&p_00[1].iPo)[iVar9 + i >> 5] =
             (&p_00[1].iPo)[iVar9 + i >> 5] | 1 << ((byte)(iVar9 + i) & 0x1f);
      }
      iVar4 = pAVar6->nTruePis;
    }
    if (iVar7 == 0) {
      lVar8 = 0;
      while( true ) {
        pAVar6 = p->pAig;
        iVar3 = pAVar6->nRegs;
        if (iVar3 <= lVar8) break;
        Vec_PtrEntry(pAVar6->vCis,pAVar6->nTruePis + (int)lVar8);
        pcVar1 = string + lVar8;
        lVar8 = lVar8 + 1;
        if (*pcVar1 != '\0') {
          __assert_fail("pValues[i] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Reach.c"
                        ,0x229,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
        }
      }
      goto LAB_00660365;
    }
    local_48 = Llb_CoreComputeCube(p->dd,p->vGlo2Ns,1,string);
    Cudd_Ref(local_48);
  } while( true );
}

Assistant:

Abc_Cex_t * Llb_ManReachDeriveCex( Llb_Man_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    DdNode * bState = NULL, * bImage, * bOneCube, * bTemp, * bRing;
    int i, v, RetValue, nPiOffset;
    char * pValues = ABC_ALLOC( char, Cudd_ReadSize(p->ddR) );
    assert( Vec_PtrSize(p->vRings) > 0 );

    p->dd->TimeStop  = 0;
    p->ddR->TimeStop = 0;

/*
    Saig_ManForEachLo( p->pAig, pObj, i )
        printf( "%d ", pObj->Id );
    printf( "\n" );
    Saig_ManForEachLi( p->pAig, pObj, i )
        printf( "%d(%d) ", pObj->Id, Aig_ObjFaninId0(pObj) );
    printf( "\n" );
*/
    // allocate room for the counter-example
    pCex = Abc_CexAlloc( Saig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), Vec_PtrSize(p->vRings) );
    pCex->iFrame = Vec_PtrSize(p->vRings) - 1;
    pCex->iPo = -1;

    // get the last cube
    bOneCube = Cudd_bddIntersect( p->ddR, (DdNode *)Vec_PtrEntryLast(p->vRings), p->ddR->bFunc );  Cudd_Ref( bOneCube );
    RetValue = Cudd_bddPickOneCube( p->ddR, bOneCube, pValues );
    Cudd_RecursiveDeref( p->ddR, bOneCube );
    assert( RetValue );

    // write PIs of counter-example
    nPiOffset = Saig_ManRegNum(p->pAig) + Saig_ManPiNum(p->pAig) * (Vec_PtrSize(p->vRings) - 1);
    Saig_ManForEachPi( p->pAig, pObj, i )
        if ( pValues[Saig_ManRegNum(p->pAig)+i] == 1 )
            Abc_InfoSetBit( pCex->pData, nPiOffset + i );

    // write state in terms of NS variables
    if ( Vec_PtrSize(p->vRings) > 1 )
    {
        bState = Llb_CoreComputeCube( p->dd, p->vGlo2Ns, 1, pValues );   Cudd_Ref( bState );
    }
    // perform backward analysis
    Vec_PtrForEachEntryReverse( DdNode *, p->vRings, bRing, v )
    { 
        if ( v == Vec_PtrSize(p->vRings) - 1 )
            continue;
//Extra_bddPrintSupport( p->dd, bState );  printf( "\n" );
//Extra_bddPrintSupport( p->dd, bRing );   printf( "\n" );
        // compute the next states
        bImage = Llb_ManComputeImage( p, bState, 1 ); 
        assert( bImage != NULL );
        Cudd_Ref( bImage );
        Cudd_RecursiveDeref( p->dd, bState );
//Extra_bddPrintSupport( p->dd, bImage );  printf( "\n" );

        // move reached states into ring manager
        bImage = Extra_TransferPermute( p->dd, p->ddR, bTemp = bImage, Vec_IntArray(p->vCs2Glo) );    Cudd_Ref( bImage );
        Cudd_RecursiveDeref( p->dd, bTemp );
//Extra_bddPrintSupport( p->ddR, bImage );  printf( "\n" );

        // intersect with the previous set
        bOneCube = Cudd_bddIntersect( p->ddR, bImage, bRing );                Cudd_Ref( bOneCube );
        Cudd_RecursiveDeref( p->ddR, bImage );

        // find any assignment of the BDD
        RetValue = Cudd_bddPickOneCube( p->ddR, bOneCube, pValues );
        Cudd_RecursiveDeref( p->ddR, bOneCube );
        assert( RetValue );
/*
        for ( i = 0; i < p->ddR->size; i++ )
            printf( "%d ", pValues[i] );
        printf( "\n" );
*/
        // write PIs of counter-example
        nPiOffset -= Saig_ManPiNum(p->pAig);
        Saig_ManForEachPi( p->pAig, pObj, i )
            if ( pValues[Saig_ManRegNum(p->pAig)+i] == 1 )
                Abc_InfoSetBit( pCex->pData, nPiOffset + i );

        // check that we get the init state
        if ( v == 0 )
        {
            Saig_ManForEachLo( p->pAig, pObj, i )
                assert( pValues[i] == 0 );
            break;
        }

        // write state in terms of NS variables
        bState = Llb_CoreComputeCube( p->dd, p->vGlo2Ns, 1, pValues );   Cudd_Ref( bState );
    }
    assert( nPiOffset == Saig_ManRegNum(p->pAig) );
    // update the output number
//Abc_CexPrint( pCex );
    RetValue = Saig_ManFindFailedPoCex( p->pAigGlo, pCex );
    assert( RetValue >= 0 && RetValue < Saig_ManPoNum(p->pAigGlo) ); // invalid CEX!!!
    pCex->iPo = RetValue;
    // cleanup
    ABC_FREE( pValues );
    return pCex;
}